

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O1

CVmException * err_get_cur_exc(void)

{
  byte *pbVar1;
  long in_FS_OFFSET;
  
  pbVar1 = *(byte **)(in_FS_OFFSET + -8);
  while( true ) {
    if (pbVar1 == (byte *)0x0) {
      return (CVmException *)0x0;
    }
    if ((*pbVar1 & 2) != 0) break;
    pbVar1 = *(byte **)(pbVar1 + 8);
  }
  return *(CVmException **)(pbVar1 + 0x10);
}

Assistant:

CVmException *err_get_cur_exc()
{
    /* 
     *   search the error frame stack for a frame in the 'caught exception'
     *   state, starting at the current (innermost) frame 
     */
    for (err_frame_t *fr = os_tls_get(err_frame_t *, G_err_frame) ;
         fr != 0 ; fr = fr->prv_)
    {
        /* if this frame is in the 'caught' state, return its exception */
        if ((fr->state_ & ERR_STATE_CAUGHT) != 0)
            return fr->exc_;
    }

    /* didn't find an exception */
    return 0;
}